

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void __thiscall
gulcalc::setmaxloss(gulcalc *this,
                   vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                   *gilv)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  pointer pgVar4;
  double dVar5;
  __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
  local_50;
  gulItemIDLoss *local_48;
  gulItemIDLoss *local_40;
  __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
  local_38;
  __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
  local_30;
  iterator iter;
  int max_loss_count;
  OASIS_FLOAT max_loss;
  size_t i;
  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
  *gilv_local;
  gulcalc *this_local;
  
  _max_loss_count = 3;
  while( true ) {
    sVar2 = std::
            vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
            ::size(gilv);
    if (sVar2 <= _max_loss_count) break;
    iter._M_current._4_4_ = 0.0;
    iter._M_current._0_4_ = 0;
    pvVar3 = std::
             vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
             ::operator[](gilv,_max_loss_count);
    local_30._M_current =
         (gulItemIDLoss *)std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::begin(pvVar3);
    while( true ) {
      pvVar3 = std::
               vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               ::operator[](gilv,_max_loss_count);
      local_38._M_current =
           (gulItemIDLoss *)std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::end(pvVar3);
      bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
      if (!bVar1) break;
      pgVar4 = __gnu_cxx::
               __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
               ::operator->(&local_30);
      if ((double)iter._M_current._4_4_ < pgVar4->loss) {
        pgVar4 = __gnu_cxx::
                 __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
                 ::operator->(&local_30);
        iter._M_current._4_4_ = (float)pgVar4->loss;
        iter._M_current._0_4_ = 0;
      }
      pgVar4 = __gnu_cxx::
               __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
               ::operator->(&local_30);
      if ((pgVar4->loss == (double)iter._M_current._4_4_) &&
         (!NAN(pgVar4->loss) && !NAN((double)iter._M_current._4_4_))) {
        iter._M_current._0_4_ = (int)iter._M_current + 1;
      }
      local_40 = (gulItemIDLoss *)
                 __gnu_cxx::
                 __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
                 ::operator++(&local_30,0);
    }
    pvVar3 = std::
             vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
             ::operator[](gilv,_max_loss_count);
    local_48 = (gulItemIDLoss *)
               std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::begin(pvVar3);
    local_30._M_current = local_48;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               ::operator[](gilv,_max_loss_count);
      local_50._M_current =
           (gulItemIDLoss *)std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::end(pvVar3);
      bVar1 = __gnu_cxx::operator!=(&local_30,&local_50);
      if (!bVar1) break;
      pgVar4 = __gnu_cxx::
               __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
               ::operator->(&local_30);
      if ((pgVar4->loss != (double)iter._M_current._4_4_) ||
         (NAN(pgVar4->loss) || NAN((double)iter._M_current._4_4_))) {
        pgVar4 = __gnu_cxx::
                 __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
                 ::operator->(&local_30);
        pgVar4->loss = 0.0;
      }
      else {
        dVar5 = (double)(int)iter._M_current;
        pgVar4 = __gnu_cxx::
                 __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
                 ::operator->(&local_30);
        pgVar4->loss = pgVar4->loss / dVar5;
      }
      __gnu_cxx::
      __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
      ::operator++(&local_30,0);
    }
    _max_loss_count = _max_loss_count + 1;
  }
  return;
}

Assistant:

void gulcalc::setmaxloss(std::vector<std::vector<gulItemIDLoss>> &gilv) {

	for (size_t i = 3; i < gilv.size(); i++) {

		OASIS_FLOAT max_loss = 0.0;
		int max_loss_count = 0;

		// First loop: find maximum loss and count occurrences
		auto iter = gilv[i].begin();
		while (iter != gilv[i].end()) {
			if (iter->loss > max_loss) {
				max_loss = iter->loss;
				max_loss_count = 0;
			}
			if (iter->loss == max_loss) max_loss_count++;
			iter++;
		}

		// Second loop: distribute maximum losses evenly among highest
		// contributing subperils and set other losses to 0
		iter = gilv[i].begin();
		while (iter != gilv[i].end()) {
			if (iter->loss == max_loss) iter->loss /= max_loss_count;
			else iter->loss = 0;
			iter++;
		}

	}

}